

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# M68KDisassembler.c
# Opt level: O0

void d68010_bkpt(m68k_info *info)

{
  long in_RDI;
  int in_stack_00000008;
  int in_stack_0000000c;
  m68k_info *in_stack_00000010;
  
  if ((*(uint *)(in_RDI + 0x28) & 0x1e) == 0) {
    d68000_invalid((m68k_info *)0x3a1b6d);
  }
  else {
    build_absolute_jump_with_immediate
              (in_stack_00000010,in_stack_0000000c,in_stack_00000008,info._4_4_);
  }
  return;
}

Assistant:

static void d68010_bkpt(m68k_info *info)
{
	LIMIT_CPU_TYPES(info, M68010_PLUS);
	build_absolute_jump_with_immediate(info, M68K_INS_BKPT, 0, info->ir & 7);
}